

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.h
# Opt level: O2

UString * jsonnet::internal::decode_utf8(UString *__return_storage_ptr__,string *s)

{
  ulong uVar1;
  ulong uVar2;
  pointer pcVar3;
  long lVar4;
  long lVar5;
  char32_t cVar6;
  char32_t __c;
  ulong uVar7;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  uVar7 = 0;
  do {
    uVar2 = s->_M_string_length;
    if (uVar2 <= uVar7) {
      return __return_storage_ptr__;
    }
    pcVar3 = (s->_M_dataplus)._M_p;
    cVar6 = (char32_t)pcVar3[uVar7];
    __c = cVar6;
    if (pcVar3[uVar7] < '\0') {
      if ((cVar6 & 0xe0U) == 0xc0) {
        uVar1 = uVar7 + 1;
        __c = L'�';
        if ((uVar1 < uVar2) &&
           (uVar7 = uVar1, __c = (byte)pcVar3[uVar1] & 0x3f | (cVar6 & 0x1fU) << 6,
           (pcVar3[uVar1] & 0xc0U) != 0x80)) {
          __c = L'�';
        }
      }
      else if ((cVar6 & 0xf0U) == 0xe0) {
        uVar1 = uVar7 + 2;
        __c = L'�';
        if (uVar1 < uVar2) {
          lVar4 = uVar7 + 1;
          if (((int)pcVar3[lVar4] & 0xc0U) == 0x80) {
            uVar7 = uVar1;
            if (((byte)pcVar3[uVar1] & 0xffffffc0) == 0x80) {
              __c = (byte)pcVar3[uVar1] & 0x3f |
                    ((int)pcVar3[lVar4] & 0x3fU) << 6 | (cVar6 & 0xfU) << 0xc;
            }
          }
          else {
LAB_001e2982:
            uVar7 = uVar7 + 1;
            __c = L'�';
          }
        }
      }
      else {
        __c = L'�';
        if (((cVar6 & 0xf8U) == 0xf0) && (uVar1 = uVar7 + 3, uVar1 < uVar2)) {
          lVar4 = uVar7 + 1;
          if (((int)pcVar3[lVar4] & 0xc0U) != 0x80) goto LAB_001e2982;
          lVar5 = uVar7 + 2;
          if (((int)pcVar3[lVar5] & 0xc0U) == 0x80) {
            uVar7 = uVar1;
            if (((byte)pcVar3[uVar1] & 0xffffffc0) == 0x80) {
              __c = (byte)pcVar3[uVar1] & 0x3f |
                    ((int)pcVar3[lVar5] & 0x3fU) << 6 |
                    ((int)pcVar3[lVar4] & 0x3fU) << 0xc | (cVar6 & 7U) << 0x12;
            }
          }
          else {
            uVar7 = uVar7 + 2;
          }
        }
      }
    }
    std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
    push_back(__return_storage_ptr__,__c);
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

static inline UString decode_utf8(const std::string &s)
{
    UString r;
    for (size_t i = 0; i < s.length(); ++i)
        r.push_back(decode_utf8(s, i));
    return r;
}